

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  MessageLite *pMVar1;
  
  pMVar1 = &UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                      (this)->super_MessageLite;
  if (this->arena_ != (Arena *)0x0) {
    pMVar1 = CloneSlow((Arena *)0x0,pMVar1);
    return (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
           pMVar1;
  }
  return (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)pMVar1
  ;
}

Assistant:

[[nodiscard]] Value<TypeHandler>* ReleaseLast() {
    Value<TypeHandler>* result = UnsafeArenaReleaseLast<TypeHandler>();
    // Now perform a copy if we're on an arena.
    Arena* arena = GetArena();

    if (internal::DebugHardenForceCopyInRelease()) {
      auto* new_result = copy<TypeHandler>(result);
      if (arena == nullptr) delete result;
      return new_result;
    } else {
      return (arena == nullptr) ? result : copy<TypeHandler>(result);
    }
  }